

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void av1_lowbd_fwd_txfm2d_8x8_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t iVar1;
  char cVar2;
  int8_t *piVar3;
  int iVar4;
  int iVar5;
  byte in_CL;
  int in_EDX;
  int16_t *in_RDI;
  int lr_flip;
  int ud_flip;
  transform_1d_sse2 row_txfm;
  transform_1d_sse2 col_txfm;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *buf;
  __m128i buf1 [8];
  __m128i buf0 [8];
  int in_stack_000001b4;
  __m128i *in_stack_000001b8;
  __m128i *in_stack_000001c0;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  __m128i *in;
  transform_1d_sse2 in_00;
  undefined1 local_128 [128];
  longlong local_a8 [18];
  byte local_15;
  int local_14;
  int16_t *local_8;
  
  piVar3 = av1_fwd_txfm_shift_ls[1];
  local_15 = in_CL;
  local_14 = in_EDX;
  local_8 = in_RDI;
  iVar4 = get_txw_idx('\x01');
  iVar5 = get_txh_idx('\x01');
  iVar1 = av1_fwd_cos_bit_col[iVar4][iVar5];
  cVar2 = av1_fwd_cos_bit_row[iVar4][iVar5];
  in_00 = col_txfm8x8_arr[local_15];
  in = (__m128i *)row_txfm8x8_arr[local_15];
  get_flip_cfg(local_15,(int *)&stack0xfffffffffffffea4,(int *)&stack0xfffffffffffffea0);
  if (in_stack_fffffffffffffea4 == 0) {
    load_buffer_and_round_shift(local_8,local_14,(__m128i *)local_a8,(int)*piVar3);
  }
  else {
    load_buffer_and_flip_round_shift
              ((int16_t *)in_00,(int)((ulong)in >> 0x20),
               (__m128i *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c);
  }
  (*in_00)((__m128i *)local_a8,(__m128i *)local_a8,iVar1);
  if (in_stack_fffffffffffffea0 == 0) {
    transpose_round_shift_8x8(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  }
  else {
    transpose_round_shift_flip_8x8(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  }
  (*(code *)in)(local_128,local_128,(int)cVar2);
  store_buffer_16bit_to_32bit_w8_avx2
            (in,(int32_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
  return;
}

Assistant:

static void av1_lowbd_fwd_txfm2d_8x8_avx2(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // Condition to check shift bit is avoided while round shifting, by assuming
  // that shift[0] will always be positive.
  assert(shift[0] > 0);
  if (ud_flip)
    load_buffer_and_flip_round_shift(input, stride, buf0, shift[0]);
  else
    load_buffer_and_round_shift(input, stride, buf0, shift[0]);

  col_txfm(buf0, buf0, cos_bit_col);
  // Condition to check shift bit is avoided while round shifting, by assuming
  // that shift[1] will always be negative.
  assert(shift[1] < 0);

  if (lr_flip) {
    transpose_round_shift_flip_8x8(buf0, buf1, shift[1]);
  } else {
    transpose_round_shift_8x8(buf0, buf1, shift[1]);
  }

  buf = buf1;
  row_txfm(buf, buf, cos_bit_row);

  // Round and shift operation is avoided here as the shift bit is assumed to be
  // zero always.
  assert(shift[2] == 0);
  store_buffer_16bit_to_32bit_w8_avx2(buf, output, 8, 8);
}